

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_1::AggregateErrorCollector::AddError
          (AggregateErrorCollector *this,int line,int column,string *message)

{
  byte bVar1;
  string *message_local;
  int column_local;
  int line_local;
  AggregateErrorCollector *this_local;
  
  bVar1 = std::__cxx11::string::empty();
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)&this->error_,"; ");
  }
  std::__cxx11::string::operator+=((string *)&this->error_,(string *)message);
  return;
}

Assistant:

virtual void AddError(int line, int column, const string& message) {
    if (!error_.empty()) {
      error_ += "; ";
    }
    error_ += message;
  }